

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QByteArray>::appendIteratorRange<char_const(*)[14]>
          (QCommonArrayOps<QByteArray> *this,char (*b) [14],char (*e) [14],
          IfIsForwardIterator<const_char_(*)[14]> param_3)

{
  qsizetype *pqVar1;
  QByteArray *this_00;
  
  this_00 = (this->super_Type).super_QGenericArrayOps<QByteArray>.
            super_QArrayDataPointer<QByteArray>.ptr +
            (this->super_Type).super_QGenericArrayOps<QByteArray>.
            super_QArrayDataPointer<QByteArray>.size;
  for (; b != e; b = b + 1) {
    QByteArray::QByteArray(this_00,*b,-1);
    pqVar1 = &(this->super_Type).super_QGenericArrayOps<QByteArray>.
              super_QArrayDataPointer<QByteArray>.size;
    *pqVar1 = *pqVar1 + 1;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }